

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QXmlStreamNamespaceDeclaration>::resize
          (QList<QXmlStreamNamespaceDeclaration> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QXmlStreamNamespaceDeclaration> *in_RSI;
  QArrayDataPointer<QXmlStreamNamespaceDeclaration> *in_RDI;
  QList<QXmlStreamNamespaceDeclaration> *unaff_retaddr;
  QArrayDataPointer<QXmlStreamNamespaceDeclaration> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QXmlStreamNamespaceDeclaration>::size
                    ((QList<QXmlStreamNamespaceDeclaration> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QXmlStreamNamespaceDeclaration>::operator->(in_RDI);
    QArrayDataPointer<QXmlStreamNamespaceDeclaration>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }